

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStepInnerStepper_FreeVecs(MRIStepInnerStepper stepper)

{
  int iVar1;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    iVar1 = -0x16;
  }
  else {
    arkFreeVecArray(stepper->nforcing,&stepper->forcing,stepper->lrw1,&stepper->lrw,stepper->liw1,
                    &stepper->liw);
    if (stepper->vecs != (N_Vector *)0x0) {
      free(stepper->vecs);
      stepper->vecs = (N_Vector *)0x0;
    }
    iVar1 = 0;
    if (stepper->vals != (realtype *)0x0) {
      free(stepper->vals);
      stepper->vals = (realtype *)0x0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mriStepInnerStepper_FreeVecs(MRIStepInnerStepper stepper)
{
  if (stepper == NULL) return ARK_ILL_INPUT;

  arkFreeVecArray(stepper->nforcing, &(stepper->forcing),
                  stepper->lrw1, &(stepper->lrw),
                  stepper->liw1, &(stepper->liw));

  if (stepper->vecs != NULL) {
    free(stepper->vecs);
    stepper->vecs = NULL;
  }

  if (stepper->vals != NULL) {
    free(stepper->vals);
    stepper->vals = NULL;
  }

  return(ARK_SUCCESS);
}